

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

void tcu::x11::glx::checkGlxExtension(GlxDisplay *dpy,char *extName)

{
  bool bVar1;
  ostream *poVar2;
  NotSupportedError *this;
  char *local_1b0;
  ostringstream oss;
  
  bVar1 = GlxDisplay::isGlxExtensionSupported(dpy,extName);
  if (bVar1) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"GLX extension \"");
  poVar2 = std::operator<<(poVar2,extName);
  std::operator<<(poVar2,"\" not supported");
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  NotSupportedError::NotSupportedError
            (this,local_1b0,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x112);
  __cxa_throw(this,&NotSupportedError::typeinfo,Exception::~Exception);
}

Assistant:

static void checkGlxExtension (const GlxDisplay& dpy, const char* extName)
{
	if (!dpy.isGlxExtensionSupported(extName))
	{
		ostringstream oss;
		oss << "GLX extension \"" << extName << "\" not supported";
		TCU_THROW(NotSupportedError, oss.str().c_str());
	}
}